

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status google::protobuf::json_internal::JsonToBinaryStream
                 (TypeResolver *resolver,string *type_url,ZeroCopyInputStream *json_input,
                 ZeroCopyOutputStream *binary_output,ParseOptions options)

{
  bool bVar1;
  Status *x;
  Message **ppMVar2;
  string_view sVar3;
  StringOutputStream *local_2e0;
  ArrayInputStream *local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2b8;
  Status local_2a8;
  Status local_2a0;
  uint local_298;
  byte local_291;
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> desc;
  ResolverPool pool;
  Msg<ParseProto3Type> msg;
  undefined1 local_178 [8];
  JsonLexer lex;
  undefined1 local_e0 [8];
  MessagePath path;
  Status local_b8;
  Status s;
  optional<google::protobuf::io::StringOutputStream> tee_output;
  optional<google::protobuf::io::ArrayInputStream> tee_input;
  string out;
  string copy;
  ZeroCopyOutputStream *binary_output_local;
  ZeroCopyInputStream *json_input_local;
  string *type_url_local;
  TypeResolver *resolver_local;
  Status *_status;
  
  local_2e0 = options._0_8_;
  std::__cxx11::string::string((string *)(out.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &tee_input.super__Optional_base<google::protobuf::io::ArrayInputStream,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::ArrayInputStream,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::io::ArrayInputStream>._M_engaged);
  std::optional<google::protobuf::io::ArrayInputStream>::optional
            ((optional<google::protobuf::io::ArrayInputStream> *)
             &tee_output.
              super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged);
  std::optional<google::protobuf::io::StringOutputStream>::optional
            ((optional<google::protobuf::io::StringOutputStream> *)&s);
  absl::lts_20240722::Status::Status(&local_b8);
  sVar3 = (string_view)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)json_input);
  lex.path_ = (MessagePath *)sVar3._M_len;
  MessagePath::MessagePath((MessagePath *)local_e0,sVar3);
  bVar1 = std::optional<google::protobuf::io::ArrayInputStream>::has_value
                    ((optional<google::protobuf::io::ArrayInputStream> *)
                     &tee_output.
                      super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>.
                      _M_payload.
                      super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>
                      .super__Optional_payload_base<google::protobuf::io::StringOutputStream>.
                      _M_engaged);
  local_2d8 = (ArrayInputStream *)binary_output;
  if (bVar1) {
    local_2d8 = std::optional<google::protobuf::io::ArrayInputStream>::operator*
                          ((optional<google::protobuf::io::ArrayInputStream> *)
                           &tee_output.
                            super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>
                            .super__Optional_payload_base<google::protobuf::io::StringOutputStream>.
                            _M_engaged);
  }
  JsonLexer::JsonLexer
            ((JsonLexer *)local_178,&local_2d8->super_ZeroCopyInputStream,
             (ParseOptions *)&stack0x00000008,(MessagePath *)local_e0,
             (JsonLocation)ZEXT1632(ZEXT816(0)));
  bVar1 = std::optional<google::protobuf::io::StringOutputStream>::has_value
                    ((optional<google::protobuf::io::StringOutputStream> *)&s);
  if (bVar1) {
    local_2e0 = std::optional<google::protobuf::io::StringOutputStream>::operator*
                          ((optional<google::protobuf::io::StringOutputStream> *)&s);
  }
  ParseProto3Type::Msg::Msg((Msg *)&pool.resolver_,&local_2e0->super_ZeroCopyOutputStream);
  ResolverPool::ResolverPool
            ((ResolverPool *)
             &desc.
              super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
              field_1,(TypeResolver *)type_url);
  local_290 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)json_input);
  sVar3._M_str = local_290._0_8_;
  sVar3._M_len = (size_t)&desc.
                          super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                          .field_1;
  ResolverPool::FindMessage((ResolverPool *)local_280,sVar3);
  local_291 = 0;
  x = absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>::
      status((StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> *)local_280);
  absl::lts_20240722::Status::Status((Status *)resolver,x);
  bVar1 = absl::lts_20240722::Status::ok((Status *)resolver);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    local_291 = 1;
  }
  local_298 = (uint)bVar1;
  if ((local_291 & 1) == 0) {
    absl::lts_20240722::Status::~Status((Status *)resolver);
  }
  if (local_298 == 0) {
    ppMVar2 = absl::lts_20240722::
              StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>::operator*
                        ((StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> *
                         )local_280);
    anon_unknown_5::ParseMessage<google::protobuf::json_internal::ParseProto3Type>
              ((anon_unknown_5 *)&local_2a0,(JsonLexer *)local_178,*ppMVar2,
               (Msg<google::protobuf::json_internal::ParseProto3Type> *)&pool.resolver_,false);
    absl::lts_20240722::Status::operator=(&local_b8,&local_2a0);
    absl::lts_20240722::Status::~Status(&local_2a0);
    bVar1 = absl::lts_20240722::Status::ok(&local_b8);
    if (bVar1) {
      bVar1 = JsonLexer::AtEof((JsonLexer *)local_178);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_2b8,"extraneous characters after end of JSON object");
        absl::lts_20240722::InvalidArgumentError(&local_2a8,local_2b8._M_len,local_2b8._M_str);
        absl::lts_20240722::Status::operator=(&local_b8,&local_2a8);
        absl::lts_20240722::Status::~Status(&local_2a8);
      }
    }
    local_298 = 0;
  }
  absl::lts_20240722::StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*>::
  ~StatusOr((StatusOr<const_google::protobuf::json_internal::ResolverPool::Message_*> *)local_280);
  ResolverPool::~ResolverPool
            ((ResolverPool *)
             &desc.
              super_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>.
              field_1);
  ParseProto3Type::Msg::~Msg((Msg *)&pool.resolver_);
  JsonLexer::~JsonLexer((JsonLexer *)local_178);
  MessagePath::~MessagePath((MessagePath *)local_e0);
  if (local_298 == 0) {
    absl::lts_20240722::Status::Status((Status *)resolver,&local_b8);
    local_298 = 1;
  }
  absl::lts_20240722::Status::~Status(&local_b8);
  std::optional<google::protobuf::io::StringOutputStream>::~optional
            ((optional<google::protobuf::io::StringOutputStream> *)&s);
  std::optional<google::protobuf::io::ArrayInputStream>::~optional
            ((optional<google::protobuf::io::ArrayInputStream> *)
             &tee_output.
              super__Optional_base<google::protobuf::io::StringOutputStream,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::StringOutputStream,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::io::StringOutputStream>._M_engaged);
  std::__cxx11::string::~string
            ((string *)
             &tee_input.super__Optional_base<google::protobuf::io::ArrayInputStream,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::io::ArrayInputStream,_true,_false,_false>.
              super__Optional_payload_base<google::protobuf::io::ArrayInputStream>._M_engaged);
  std::__cxx11::string::~string((string *)(out.field_2._M_local_buf + 8));
  return (Status)(uintptr_t)resolver;
}

Assistant:

absl::Status JsonToBinaryStream(google::protobuf::util::TypeResolver* resolver,
                                const std::string& type_url,
                                io::ZeroCopyInputStream* json_input,
                                io::ZeroCopyOutputStream* binary_output,
                                json_internal::ParseOptions options) {
  // NOTE: Most of the contortions in this function are to allow for capture of
  // input and output of the parser in ABSL_DLOG mode. Destruction order is very
  // critical in this function, because io::ZeroCopy*Stream types usually only
  // flush on destruction.

  // For ABSL_DLOG, we would like to print out the input and output, which
  // requires buffering both instead of doing "zero copy". This block, and the
  // one at the end of the function, set up and tear down interception of the
  // input and output streams.
  std::string copy;
  std::string out;
  absl::optional<io::ArrayInputStream> tee_input;
  absl::optional<io::StringOutputStream> tee_output;
  if (PROTOBUF_DEBUG) {
    const void* data;
    int len;
    while (json_input->Next(&data, &len)) {
      copy.resize(copy.size() + len);
      std::memcpy(&copy[copy.size() - len], data, len);
    }
    tee_input.emplace(copy.data(), copy.size());
    tee_output.emplace(&out);
    ABSL_DLOG(INFO) << "json2/input: " << absl::CHexEscape(copy);
  }

  // This scope forces the CodedOutputStream inside of `msg` to flush before we
  // possibly handle logging the binary protobuf output.
  absl::Status s;
  {
    MessagePath path(type_url);
    JsonLexer lex(tee_input.has_value() ? &*tee_input : json_input, options,
                  &path);
    Msg<ParseProto3Type> msg(tee_output.has_value() ? &*tee_output
                                                    : binary_output);

    ResolverPool pool(resolver);
    auto desc = pool.FindMessage(type_url);
    RETURN_IF_ERROR(desc.status());

    s = ParseMessage<ParseProto3Type>(lex, **desc, msg, /*any_reparse=*/false);
    if (s.ok() && !lex.AtEof()) {
      s = absl::InvalidArgumentError(
          "extraneous characters after end of JSON object");
    }
  }

  if (PROTOBUF_DEBUG) {
    tee_output.reset();  // Flush the output stream.
    io::zc_sink_internal::ZeroCopyStreamByteSink(binary_output)
        .Append(out.data(), out.size());
    ABSL_DLOG(INFO) << "json2/status: " << s;
    ABSL_DLOG(INFO) << "json2/output: " << absl::BytesToHexString(out);
  }

  return s;
}